

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O0

int send_twin_operation_request
              (TWIN_MESSENGER_INSTANCE_conflict *twin_msgr,TWIN_OPERATION_CONTEXT *op_ctx,
              CONSTBUFFER_HANDLE data)

{
  char *pcVar1;
  int iVar2;
  MESSAGE_HANDLE message;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  time_t tVar5;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  MESSAGE_HANDLE amqp_message;
  int result;
  CONSTBUFFER_HANDLE data_local;
  TWIN_OPERATION_CONTEXT *op_ctx_local;
  TWIN_MESSENGER_INSTANCE_conflict *twin_msgr_local;
  
  message = create_amqp_message_for_twin_operation(op_ctx->type,op_ctx->correlation_id,data);
  if (message == (MESSAGE_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar1 = twin_msgr->device_id;
      pcVar4 = TWIN_OPERATION_TYPEStrings(op_ctx->type);
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"send_twin_operation_request",0x3bd,1,
                "Failed creating request message (%s, %s, %s)",pcVar1,pcVar4,op_ctx->correlation_id)
      ;
    }
    amqp_message._4_4_ = 0x3be;
  }
  else {
    tVar5 = get_time((time_t *)0x0);
    op_ctx->time_sent = tVar5;
    if (tVar5 == -1) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar1 = twin_msgr->device_id;
        pcVar4 = TWIN_OPERATION_TYPEStrings(op_ctx->type);
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                  ,"send_twin_operation_request",0x3c4,1,
                  "Failed setting TWIN operation sent time (%s, %s, %s)",pcVar1,pcVar4,
                  op_ctx->correlation_id);
      }
      amqp_message._4_4_ = 0x3c5;
    }
    else {
      iVar2 = amqp_messenger_send_async
                        (twin_msgr->amqp_msgr,message,on_amqp_send_complete_callback,op_ctx);
      if (iVar2 == 0) {
        amqp_message._4_4_ = 0;
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar1 = twin_msgr->device_id;
          pcVar4 = TWIN_OPERATION_TYPEStrings(op_ctx->type);
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"send_twin_operation_request",0x3c9,1,
                    "Failed sending request message for (%s, %s, %s)",pcVar1,pcVar4,
                    op_ctx->correlation_id);
        }
        amqp_message._4_4_ = 0x3ca;
      }
    }
    message_destroy(message);
  }
  return amqp_message._4_4_;
}

Assistant:

static int send_twin_operation_request(TWIN_MESSENGER_INSTANCE* twin_msgr, TWIN_OPERATION_CONTEXT* op_ctx, CONSTBUFFER_HANDLE data)
{
    int result;
    MESSAGE_HANDLE amqp_message;

    if ((amqp_message = create_amqp_message_for_twin_operation(op_ctx->type, op_ctx->correlation_id, data)) == NULL)
    {
        LogError("Failed creating request message (%s, %s, %s)", twin_msgr->device_id, MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, op_ctx->type), op_ctx->correlation_id);
        result = MU_FAILURE;
    }
    else
    {
        if ((op_ctx->time_sent = get_time(NULL)) == INDEFINITE_TIME)
        {
            LogError("Failed setting TWIN operation sent time (%s, %s, %s)", twin_msgr->device_id, MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, op_ctx->type), op_ctx->correlation_id);
            result = MU_FAILURE;
        }
        else if (amqp_messenger_send_async(twin_msgr->amqp_msgr, amqp_message, on_amqp_send_complete_callback, (void*)op_ctx) != 0)
        {
            LogError("Failed sending request message for (%s, %s, %s)", twin_msgr->device_id, MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, op_ctx->type), op_ctx->correlation_id);
            result = MU_FAILURE;
        }
        else
        {
            result = RESULT_OK;
        }

        message_destroy(amqp_message);
    }

    return result;
}